

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O3

void __thiscall
ImStb::stb_textedit_find_charpos
          (ImStb *this,StbFindState *find,ImGuiInputTextState *str,int n,int single_line)

{
  ImWchar *pIVar1;
  ushort uVar2;
  ImFont *pIVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  ImWchar *local_40;
  ImStb *local_38;
  
  fVar11 = SUB84(str,0);
  if (find->y == fVar11) {
    if (n == 0) {
      *(undefined8 *)this = 0;
      *(undefined4 *)(this + 8) = 0x3f800000;
      iVar6 = 0;
      local_38 = this;
      if ((int)fVar11 < 1) {
        iVar7 = 0;
      }
      else {
        iVar6 = 0;
        do {
          iVar7 = iVar6;
          local_40 = (ImWchar *)0x0;
          pIVar1 = (ImWchar *)(*(long *)(find + 1) + (long)iVar7 * 2);
          InputTextCalcTextSizeW
                    (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_40,
                     (ImVec2 *)0x1,SUB41(single_line,0));
          iVar6 = iVar7 + (int)((ulong)((long)local_40 - (long)pIVar1) >> 1);
        } while (iVar6 < (int)fVar11);
      }
      *(int *)(local_38 + 0xc) = iVar6;
      *(undefined4 *)(local_38 + 0x10) = 0;
      *(int *)(local_38 + 0x14) = iVar7;
    }
    else {
      IVar12 = InputTextCalcTextSizeW
                         (*(ImWchar **)(find + 1),*(ImWchar **)(find + 1) + (int)fVar11,&local_40,
                          (ImVec2 *)0x1,SUB41(single_line,0));
      *(undefined4 *)(this + 4) = 0;
      *(undefined4 *)(this + 0xc) = 0;
      *(float *)(this + 0x10) = fVar11;
      *(float *)(this + 8) = IVar12.y;
      *(float *)this = IVar12.x;
    }
  }
  else {
    fVar10 = 0.0;
    local_38 = (ImStb *)((ulong)local_38 & 0xffffffff00000000);
    iVar6 = 0;
    while( true ) {
      *(float *)(this + 4) = fVar10;
      local_40 = (ImWchar *)0x0;
      lVar8 = (long)iVar6;
      pIVar1 = (ImWchar *)(*(long *)(find + 1) + lVar8 * 2);
      IVar12 = InputTextCalcTextSizeW
                         (pIVar1,(ImWchar *)(*(long *)(find + 1) + (long)(int)find->y * 2),&local_40
                          ,(ImVec2 *)0x1,SUB41(single_line,0));
      iVar7 = (int)((ulong)((long)local_40 - (long)pIVar1) >> 1);
      iVar4 = iVar6 + iVar7;
      if ((int)fVar11 < iVar4) break;
      fVar10 = IVar12.y + *(float *)(this + 4);
      local_38 = (ImStb *)CONCAT44(local_38._4_4_,iVar6);
      iVar6 = iVar4;
    }
    *(int *)(this + 0xc) = iVar6;
    *(int *)(this + 0x10) = iVar7;
    *(float *)(this + 8) = IVar12.y;
    *(undefined4 *)(this + 0x14) = local_38._0_4_;
    *(undefined4 *)this = 0;
    uVar9 = (ulong)(uint)((int)fVar11 - iVar6);
    if ((int)fVar11 - iVar6 != 0 && iVar6 <= (int)fVar11) {
      fVar11 = 0.0;
      do {
        uVar2 = *(ushort *)(*(long *)(find + 1) + lVar8 * 2);
        fVar10 = -1.0;
        if (uVar2 != 10) {
          pIVar3 = GImGui->Font;
          pfVar5 = &pIVar3->FallbackAdvanceX;
          if ((int)(uint)uVar2 < (pIVar3->IndexAdvanceX).Size) {
            pfVar5 = (float *)((ulong)((uint)uVar2 * 4) + (long)(pIVar3->IndexAdvanceX).Data);
          }
          fVar10 = (GImGui->FontSize / pIVar3->FontSize) * *pfVar5;
        }
        fVar11 = fVar11 + fVar10;
        *(float *)this = fVar11;
        lVar8 = lVar8 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  return;
}

Assistant:

static void stb_textedit_find_charpos(StbFindState *find, STB_TEXTEDIT_STRING *str, int n, int single_line)
{
   StbTexteditRow r;
   int prev_start = 0;
   int z = STB_TEXTEDIT_STRINGLEN(str);
   int i=0, first;

   if (n == z) {
      // if it's at the end, then find the last line -- simpler than trying to
      // explicitly handle this case in the regular code
      if (single_line) {
         STB_TEXTEDIT_LAYOUTROW(&r, str, 0);
         find->y = 0;
         find->first_char = 0;
         find->length = z;
         find->height = r.ymax - r.ymin;
         find->x = r.x1;
      } else {
         find->y = 0;
         find->x = 0;
         find->height = 1;
         while (i < z) {
            STB_TEXTEDIT_LAYOUTROW(&r, str, i);
            prev_start = i;
            i += r.num_chars;
         }
         find->first_char = i;
         find->length = 0;
         find->prev_first = prev_start;
      }
      return;
   }

   // search rows to find the one that straddles character n
   find->y = 0;

   for(;;) {
      STB_TEXTEDIT_LAYOUTROW(&r, str, i);
      if (n < i + r.num_chars)
         break;
      prev_start = i;
      i += r.num_chars;
      find->y += r.baseline_y_delta;
   }

   find->first_char = first = i;
   find->length = r.num_chars;
   find->height = r.ymax - r.ymin;
   find->prev_first = prev_start;

   // now scan to find xpos
   find->x = r.x0;
   for (i=0; first+i < n; ++i)
      find->x += STB_TEXTEDIT_GETWIDTH(str, first, i);
}